

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_sha1.c
# Opt level: O2

void ngx_sha1_update(ngx_sha1_t *ctx,void *data,size_t size)

{
  ulong uVar1;
  u_char *__dest;
  ulong __n;
  
  uVar1 = ctx->bytes;
  ctx->bytes = uVar1 + size;
  uVar1 = uVar1 & 0x3f;
  if (uVar1 != 0) {
    __n = 0x40 - uVar1;
    __dest = ctx->buffer + uVar1;
    if (size < __n) goto LAB_0011bb75;
    memcpy(__dest,data,__n);
    data = (void *)((long)data + __n);
    ngx_sha1_body(ctx,ctx->buffer,0x40);
    size = size - __n;
  }
  if (0x3f < size) {
    data = ngx_sha1_body(ctx,(u_char *)data,size & 0xffffffffffffffc0);
    size = (size_t)((uint)size & 0x3f);
  }
  __dest = ctx->buffer;
LAB_0011bb75:
  memcpy(__dest,data,size);
  return;
}

Assistant:

void
ngx_sha1_update(ngx_sha1_t *ctx, const void *data, size_t size)
{
    size_t  used, free;

    used = (size_t) (ctx->bytes & 0x3f);
    ctx->bytes += size;

    if (used) {
        free = 64 - used;

        if (size < free) {
            ngx_memcpy(&ctx->buffer[used], data, size);
            return;
        }

        ngx_memcpy(&ctx->buffer[used], data, free);
        data = (u_char *) data + free;
        size -= free;
        (void) ngx_sha1_body(ctx, ctx->buffer, 64);
    }

    if (size >= 64) {
        data = ngx_sha1_body(ctx, data, size & ~(size_t) 0x3f);
        size &= 0x3f;
    }

    ngx_memcpy(ctx->buffer, data, size);
}